

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadProcessGroup.h
# Opt level: O0

void __thiscall
IlmThread_3_3::ProcessGroup<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_true>::record_failure
          (ProcessGroup<Imf_3_3::(anonymous_namespace)::ScanLineProcess,_true> *this,char *e)

{
  bool bVar1;
  __pointer_type pbVar2;
  string *this_00;
  string *msg;
  string *cur;
  memory_order in_stack_000000cc;
  __pointer_type in_stack_000000d0;
  __pointer_type *in_stack_000000d8;
  atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *in_stack_000000e0;
  undefined8 in_stack_ffffffffffffffa0;
  atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *in_stack_ffffffffffffffa8;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  pbVar2 = std::
           atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
           ::load(in_stack_ffffffffffffffa8,(memory_order)((ulong)in_stack_ffffffffffffffa0 >> 0x20)
                 );
  if (pbVar2 == (__pointer_type)0x0) {
    this_00 = (string *)operator_new(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdf);
    bVar1 = std::
            atomic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
            ::compare_exchange_strong
                      (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000cc);
    if ((!bVar1) && (this_00 != (string *)0x0)) {
      std::__cxx11::string::~string(this_00);
      operator_delete(this_00,0x20);
    }
  }
  return;
}

Assistant:

void record_failure (const char *e)
    {
        // should we construct a list of failures if there are
        // more than one? seems less confusing to just report
        // the first we happened to record

        std::string *cur = _first_failure.load ();
        if (!cur)
        {
            std::string *msg = new std::string (e);
            if (! _first_failure.compare_exchange_strong (cur, msg))
                delete msg;
        }
    }